

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserequation.cpp
# Opt level: O2

vector<std::shared_ptr<libcellml::AnalyserEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserEquation>_>_>
* __thiscall
libcellml::AnalyserEquation::dependencies
          (vector<std::shared_ptr<libcellml::AnalyserEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserEquation>_>_>
           *__return_storage_ptr__,AnalyserEquation *this)

{
  pointer pwVar1;
  pointer pwVar2;
  __shared_ptr<libcellml::AnalyserEquation,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::AnalyserEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserEquation>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::AnalyserEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserEquation>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::AnalyserEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserEquation>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pwVar1 = (this->mPimpl->mDependencies).
           super__Vector_base<std::weak_ptr<libcellml::AnalyserEquation>,_std::allocator<std::weak_ptr<libcellml::AnalyserEquation>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pwVar2 = (this->mPimpl->mDependencies).
                super__Vector_base<std::weak_ptr<libcellml::AnalyserEquation>,_std::allocator<std::weak_ptr<libcellml::AnalyserEquation>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pwVar2 != pwVar1; pwVar2 = pwVar2 + 1) {
    std::__shared_ptr<libcellml::AnalyserEquation,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_38,pwVar2);
    std::
    vector<std::shared_ptr<libcellml::AnalyserEquation>,std::allocator<std::shared_ptr<libcellml::AnalyserEquation>>>
    ::emplace_back<std::shared_ptr<libcellml::AnalyserEquation>>
              ((vector<std::shared_ptr<libcellml::AnalyserEquation>,std::allocator<std::shared_ptr<libcellml::AnalyserEquation>>>
                *)__return_storage_ptr__,(shared_ptr<libcellml::AnalyserEquation> *)&_Stack_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<AnalyserEquationPtr> AnalyserEquation::dependencies() const
{
    std::vector<AnalyserEquationPtr> res;

    for (const auto &dependency : mPimpl->mDependencies) {
        res.push_back(dependency.lock());
    }

    return res;
}